

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

void duckdb_yyjson::dyn_free(void *ctx_ptr,void *ptr)

{
  dyn_chunk *pdVar1;
  dyn_chunk *prev;
  dyn_chunk *chunk;
  dyn_ctx *ctx;
  void *ptr_local;
  void *ctx_ptr_local;
  dyn_chunk *cur;
  dyn_chunk *prev_1;
  
  pdVar1 = (dyn_chunk *)((long)ptr + -0x10);
  prev_1 = (dyn_chunk *)((long)ctx_ptr + 0x10);
  cur = *(dyn_chunk **)((long)ctx_ptr + 0x18);
  do {
    prev = (dyn_chunk *)ctx_ptr;
    if (cur == (dyn_chunk *)0x0) {
LAB_02744a4b:
      while( true ) {
        if (prev == (dyn_chunk *)0x0) {
          return;
        }
        if ((prev->next == (dyn_chunk *)0x0) || (pdVar1->size <= prev->next->size)) break;
        prev = prev->next;
      }
      *(dyn_chunk **)((long)ptr + -8) = prev->next;
      prev->next = pdVar1;
      return;
    }
    if (cur == pdVar1) {
      prev_1->next = cur->next;
      cur->next = (dyn_chunk *)0x0;
      goto LAB_02744a4b;
    }
    prev_1 = cur;
    cur = cur->next;
  } while( true );
}

Assistant:

static void dyn_free(void *ctx_ptr, void *ptr) {
    /* assert(ptr != NULL) */
    dyn_ctx *ctx = (dyn_ctx *)ctx_ptr;
    dyn_chunk *chunk = (dyn_chunk *)ptr - 1, *prev;

    dyn_chunk_list_remove(&ctx->used_list, chunk);
    for (prev = &ctx->free_list; prev; prev = prev->next) {
        if (!prev->next || prev->next->size >= chunk->size) {
            chunk->next = prev->next;
            prev->next = chunk;
            break;
        }
    }
}